

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lib.c
# Opt level: O0

EVP_PKEY * EVP_PKEY_dup(EVP_PKEY *pkey)

{
  int iVar1;
  EVP_PKEY *pkey_00;
  stack_st_X509_ATTRIBUTE *psVar2;
  int *in_RDI;
  EVP_PKEY_ASN1_METHOD *ameth;
  EVP_PKEY *dup_pk;
  char *in_stack_ffffffffffffffe0;
  char *func;
  undefined8 in_stack_ffffffffffffffe8;
  stack_st_X509_ATTRIBUTE *in_stack_fffffffffffffff8;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  if (in_RDI == (int *)0x0) {
    ERR_new();
    ERR_set_debug((char *)in_RDI,iVar1,in_stack_ffffffffffffffe0);
    ERR_set_error(6,0xc0102,(char *)0x0);
    return (EVP_PKEY *)0x0;
  }
  pkey_00 = (EVP_PKEY *)EVP_PKEY_new();
  if (pkey_00 == (EVP_PKEY *)0x0) {
    return (EVP_PKEY *)0x0;
  }
  if ((*in_RDI != 0) || (*(long *)(in_RDI + 0x18) != 0)) {
    if (*(long *)(in_RDI + 0x18) == 0) {
      if ((*in_RDI == 0) || (*(long *)(in_RDI + 0x18) != 0)) goto LAB_00276f53;
      func = *(char **)(in_RDI + 2);
      if ((func == (char *)0x0) || (*(long *)(func + 0x130) == 0)) {
        if ((*(long *)(in_RDI + 8) != 0) ||
           (iVar1 = EVP_PKEY_set_type((EVP_PKEY *)pkey_00,*in_RDI), iVar1 == 0)) {
          ERR_new();
          ERR_set_debug((char *)in_RDI,(int)((ulong)pkey_00 >> 0x20),func);
          ERR_set_error(6,0xe0,(char *)0x0);
          goto LAB_00276f53;
        }
        goto LAB_00276ef7;
      }
      iVar1 = (**(code **)(func + 0x130))(pkey_00,in_RDI);
    }
    else {
      iVar1 = evp_keymgmt_util_copy(pkey,dup_pk,ameth._4_4_);
    }
    if (iVar1 == 0) goto LAB_00276f53;
  }
LAB_00276ef7:
  iVar1 = CRYPTO_dup_ex_data(0x11,(CRYPTO_EX_DATA *)&pkey_00->ex_data,
                             (CRYPTO_EX_DATA *)(in_RDI + 0x14));
  if (iVar1 != 0) {
    if (*(long *)(in_RDI + 0x10) == 0) {
      return pkey_00;
    }
    psVar2 = ossl_x509at_dup(in_stack_fffffffffffffff8);
    pkey_00->attributes = psVar2;
    if (psVar2 != (stack_st_X509_ATTRIBUTE *)0x0) {
      return pkey_00;
    }
  }
LAB_00276f53:
  EVP_PKEY_free((EVP_PKEY *)pkey_00);
  return (EVP_PKEY *)0x0;
}

Assistant:

EVP_PKEY *EVP_PKEY_dup(EVP_PKEY *pkey)
{
    EVP_PKEY *dup_pk;

    if (pkey == NULL) {
        ERR_raise(ERR_LIB_EVP, ERR_R_PASSED_NULL_PARAMETER);
        return NULL;
    }

    if ((dup_pk = EVP_PKEY_new()) == NULL)
        return NULL;

    if (evp_pkey_is_blank(pkey))
        goto done;

    if (evp_pkey_is_provided(pkey)) {
        if (!evp_keymgmt_util_copy(dup_pk, pkey,
                                   OSSL_KEYMGMT_SELECT_ALL))
            goto err;
        goto done;
    }

    if (evp_pkey_is_legacy(pkey)) {
        const EVP_PKEY_ASN1_METHOD *ameth = pkey->ameth;

        if (ameth == NULL || ameth->copy == NULL) {
            if (pkey->pkey.ptr == NULL /* empty key, just set type */
                && EVP_PKEY_set_type(dup_pk, pkey->type) != 0)
                goto done;
            ERR_raise(ERR_LIB_EVP, EVP_R_UNSUPPORTED_KEY_TYPE);
            goto err;
        }
        if (!ameth->copy(dup_pk, pkey))
            goto err;
        goto done;
    }

    goto err;
done:
    /* copy auxiliary data */
    if (!CRYPTO_dup_ex_data(CRYPTO_EX_INDEX_EVP_PKEY,
                            &dup_pk->ex_data, &pkey->ex_data))
        goto err;

    if (pkey->attributes != NULL) {
        if ((dup_pk->attributes = ossl_x509at_dup(pkey->attributes)) == NULL)
            goto err;
    }
    return dup_pk;
err:
    EVP_PKEY_free(dup_pk);
    return NULL;
}